

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparse<Memory::JitArenaAllocator> * __thiscall
BVSparse<Memory::JitArenaAllocator>::AndNew
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv,
          JitArenaAllocator *allocator)

{
  JitArenaAllocator *alloc;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_50;
  BVSparse<Memory::JitArenaAllocator> *local_28;
  BVSparse<Memory::JitArenaAllocator> *newBv;
  JitArenaAllocator *allocator_local;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  newBv = (BVSparse<Memory::JitArenaAllocator> *)allocator;
  allocator_local = (JitArenaAllocator *)bv;
  bv_local = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
             ,0x35c);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator
                     ,&local_50);
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
  BVSparse(this_00,(JitArenaAllocator *)newBv);
  local_28 = this_00;
  for_each<&BVUnitT<unsigned_long>::And>
            (this_00,this,(BVSparse<Memory::JitArenaAllocator> *)allocator_local);
  return local_28;
}

Assistant:

BVSparse<TAllocator> *
BVSparse<TAllocator>::AndNew(const BVSparse* bv, TAllocator* allocator) const
{
    BVSparse * newBv = AllocatorNew(TAllocator, allocator, BVSparse, allocator);
    newBv->for_each<&SparseBVUnit::And>(this, bv);
    return newBv;
}